

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

void gravity_class_blacken(gravity_vm *vm,gravity_class_t *c)

{
  uint32_t uVar1;
  uint local_1c;
  uint32_t i;
  gravity_class_t *c_local;
  gravity_vm *vm_local;
  
  uVar1 = gravity_class_size(vm,c);
  gravity_vm_memupdate(vm,(ulong)uVar1);
  gravity_gray_object(vm,c->objclass);
  gravity_gray_object(vm,c->superclass);
  gravity_hash_iterate(c->htable,gravity_hash_gray,vm);
  for (local_1c = 0; local_1c < c->nivars; local_1c = local_1c + 1) {
    gravity_gray_value(vm,c->ivars[local_1c]);
  }
  return;
}

Assistant:

void gravity_class_blacken (gravity_vm *vm, gravity_class_t *c) {
    gravity_vm_memupdate(vm, gravity_class_size(vm, c));

    // metaclass
    gravity_gray_object(vm, (gravity_object_t *)c->objclass);

    // superclass
    gravity_gray_object(vm, (gravity_object_t *)c->superclass);

    // internals
    gravity_hash_iterate(c->htable, gravity_hash_gray, (void *)vm);

    // ivars
    for (uint32_t i=0; i<c->nivars; ++i) {
        gravity_gray_value(vm, c->ivars[i]);
    }
}